

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O0

void __thiscall cfd::core::Transaction::SetFromHex(Transaction *this,string *hex_string)

{
  wally_tx *tx;
  bool bVar1;
  uint32_t *puVar2;
  bool bVar3;
  char *pcVar4;
  ulong uVar5;
  long lVar6;
  size_type sVar7;
  undefined8 uVar8;
  Amount AVar9;
  Script *in_stack_fffffffffffffa60;
  string *in_stack_fffffffffffffa70;
  undefined8 in_stack_fffffffffffffa78;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffa80;
  allocator_type *in_stack_fffffffffffffa88;
  allocator_type *__a;
  uchar *in_stack_fffffffffffffa90;
  uchar *in_stack_fffffffffffffa98;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffaa0;
  CfdException *exception;
  Script local_4b8;
  string *local_480;
  undefined1 local_478;
  Amount local_470;
  undefined1 local_460 [8];
  TxOut txout;
  undefined1 local_408 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> script_buf_1;
  wally_tx_output *txout_item;
  size_t index_1;
  int local_3d8;
  char *local_3d0;
  ByteData local_3c8;
  ScriptWitness local_3b0;
  undefined1 local_389 [9];
  vector<unsigned_char,_std::allocator<unsigned_char>_> witness_buf;
  wally_tx_witness_item *witness_stack;
  size_t w_index;
  Txid local_348;
  undefined1 local_328 [8];
  TxIn txin;
  undefined1 local_280 [8];
  Script unlocking_script;
  undefined1 local_240 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> script_buf;
  undefined1 local_220 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> txid_buf;
  wally_tx_input *txin_item;
  size_t index;
  string local_1f0 [32];
  CfdSourceLocation local_1d0;
  CfdSourceLocation local_1b8;
  undefined1 local_19a;
  allocator local_199;
  string local_198 [32];
  CfdSourceLocation local_178;
  uint32_t *local_160;
  uint8_t *work_address;
  size_t buf_size;
  size_t num_size;
  uint64_t txout_num;
  size_t size;
  uint8_t *start_address;
  int local_128;
  char *local_120;
  undefined1 local_112;
  allocator local_111;
  string local_110 [32];
  CfdSourceLocation local_f0;
  uint32_t local_d8;
  uint32_t local_d4;
  uint32_t lock_time;
  uint32_t version;
  uint8_t *address_pointer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_b0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *tx_buf;
  undefined1 local_90 [8];
  ByteData tx_byte;
  int local_64;
  wally_tx *pwStack_60;
  int ret;
  wally_tx *tx_pointer;
  vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> vout_work;
  vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> vin_work;
  bool append_txout;
  void *original_address;
  string *hex_string_local;
  Transaction *this_local;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffa78 >> 0x20);
  tx = (wally_tx *)(this->super_AbstractTransaction).wally_tx_pointer_;
  bVar1 = false;
  ::std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::vector
            ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
             &vout_work.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  ::std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::vector
            ((vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *)&tx_pointer);
  pwStack_60 = (wally_tx *)0x0;
  pcVar4 = (char *)::std::__cxx11::string::c_str();
  local_64 = wally_tx_from_hex(pcVar4,0,&stack0xffffffffffffffa0);
  if ((((local_64 == 0) && (pwStack_60->num_inputs == 0)) && (pwStack_60->num_outputs == 0)) &&
     (uVar5 = ::std::__cxx11::string::size(), 0x14 < uVar5)) {
    wally_tx_free(pwStack_60);
    pwStack_60 = (wally_tx *)0x0;
    local_64 = -2;
  }
  if (local_64 == -2) {
    StringUtil::StringToByte
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&tx_buf,(string *)hex_string
              );
    ByteData::ByteData((ByteData *)local_90,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&tx_buf);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffa70);
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&address_pointer,
                       (ByteData *)local_90);
    local_b0 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&address_pointer;
    _lock_time = (uint32_t *)
                 ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_b0);
    uVar5 = ::std::__cxx11::string::size();
    puVar2 = _lock_time;
    if (0x13 < uVar5) {
      local_d8 = 0;
      local_d4 = *_lock_time;
      puVar2 = _lock_time + 1;
      if ((char)_lock_time[1] == '\0') {
        _lock_time = (uint32_t *)((long)_lock_time + 5);
        if ((*(char *)_lock_time == '\0') && (lVar6 = ::std::__cxx11::string::size(), lVar6 == 0x14)
           ) {
          _lock_time = (uint32_t *)((long)_lock_time + 1);
          local_d8 = *_lock_time;
          local_64 = wally_tx_init_alloc(local_d4,local_d8,0,0,&stack0xffffffffffffffa0);
          if (local_64 != 0) {
            local_f0.filename =
                 strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_transaction.cpp"
                         ,0x2f);
            local_f0.filename = local_f0.filename + 1;
            local_f0.line = 0x152;
            local_f0.funcname = "SetFromHex";
            logger::warn<int&>(&local_f0,"wally_tx_init_alloc NG[{}] ",&local_64);
            local_112 = 1;
            uVar8 = __cxa_allocate_exception(0x30);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string(local_110,"transaction data generate error.",&local_111);
            CfdException::CfdException
                      (in_stack_fffffffffffffa80,error_code,in_stack_fffffffffffffa70);
            local_112 = 0;
            __cxa_throw(uVar8,&CfdException::typeinfo,CfdException::~CfdException);
          }
          pcVar4 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_transaction.cpp"
                           ,0x2f);
          start_address = (uint8_t *)(pcVar4 + 1);
          local_128 = 0x156;
          local_120 = "SetFromHex";
          logger::info<>((CfdSourceLocation *)&start_address,"call wally_tx_init_alloc");
          puVar2 = _lock_time;
        }
        else {
          size = (size_t)::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                   (local_b0);
          txout_num = (long)_lock_time - size;
          num_size = 0;
          buf_size = 0;
          sVar7 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_b0);
          work_address = (uint8_t *)((sVar7 - txout_num) - 4);
          bVar3 = AbstractTransaction::GetVariableInt
                            ((uint8_t *)_lock_time,(size_t)work_address,&num_size,&buf_size);
          puVar2 = _lock_time;
          if ((bVar3) &&
             (bVar3 = CheckTxOutBuffer((uint8_t *)_lock_time,(size_t)work_address,num_size,buf_size,
                                       (void *)0x0,
                                       (vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>
                                        *)0x0), puVar2 = _lock_time, bVar3)) {
            local_160 = (uint32_t *)((long)_lock_time + (long)work_address);
            local_d8 = *local_160;
            local_64 = wally_tx_init_alloc(local_d4,local_d8,0,0,&stack0xffffffffffffffa0);
            if (local_64 != 0) {
              local_178.filename =
                   strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_transaction.cpp"
                           ,0x2f);
              local_178.filename = local_178.filename + 1;
              local_178.line = 0x16d;
              local_178.funcname = "SetFromHex";
              logger::warn<int&>(&local_178,"wally_tx_init_alloc NG[{}] ",&local_64);
              local_19a = 1;
              uVar8 = __cxa_allocate_exception(0x30);
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_198,"transaction data generate error.",&local_199);
              CfdException::CfdException
                        (in_stack_fffffffffffffa80,error_code,in_stack_fffffffffffffa70);
              local_19a = 0;
              __cxa_throw(uVar8,&CfdException::typeinfo,CfdException::~CfdException);
            }
            local_1b8.filename =
                 strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_transaction.cpp"
                         ,0x2f);
            local_1b8.filename = local_1b8.filename + 1;
            local_1b8.line = 0x172;
            local_1b8.funcname = "SetFromHex";
            logger::info<>(&local_1b8,"call wally_tx_init_alloc");
            bVar1 = true;
            CheckTxOutBuffer((uint8_t *)_lock_time,(size_t)work_address,num_size,buf_size,pwStack_60
                             ,(vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *)
                              &tx_pointer);
            puVar2 = _lock_time;
          }
        }
      }
    }
    _lock_time = puVar2;
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffa70);
    ByteData::~ByteData((ByteData *)0x434ce7);
  }
  if (local_64 == 0) {
    (this->super_AbstractTransaction).wally_tx_pointer_ = pwStack_60;
    for (txin_item = (wally_tx_input *)0x0; txin_item < (wally_tx_input *)pwStack_60->num_inputs;
        txin_item = (wally_tx_input *)(txin_item->txhash + 1)) {
      txid_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = pwStack_60->inputs[(long)txin_item].txhash;
      ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x434eac);
      ::std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
                (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
                 in_stack_fffffffffffffa88);
      ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x434edb);
      ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x434f0e);
      ::std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
                (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
                 in_stack_fffffffffffffa88);
      ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x434f3d);
      ByteData::ByteData((ByteData *)
                         ((long)&txin.super_AbstractTxIn.script_witness_.witness_stack_.
                                 super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                 ._M_impl.super__Vector_impl_data + 0x10),
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_240);
      Script::Script((Script *)local_280,
                     (ByteData *)
                     ((long)&txin.super_AbstractTxIn.script_witness_.witness_stack_.
                             super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                             ._M_impl.super__Vector_impl_data + 0x10));
      ByteData::~ByteData((ByteData *)0x434f73);
      ByteData256::ByteData256
                ((ByteData256 *)&w_index,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_220);
      Txid::Txid(&local_348,(ByteData256 *)&w_index);
      TxIn::TxIn((TxIn *)local_328,&local_348,
                 *(uint32_t *)
                  (txid_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 0x20),
                 *(uint32_t *)
                  (txid_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 0x24),(Script *)local_280);
      Txid::~Txid((Txid *)0x434fd2);
      ByteData256::~ByteData256((ByteData256 *)0x434fde);
      if ((*(long *)(txid_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 0x38) != 0) &&
         (*(long *)(*(long *)(txid_buf.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + 0x38) + 8) != 0))
      {
        for (witness_stack = (wally_tx_witness_item *)0x0;
            witness_stack <
            *(wally_tx_witness_item **)
             (*(long *)(txid_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage + 0x38) + 8);
            witness_stack = (wally_tx_witness_item *)((long)&witness_stack->witness + 1)) {
          witness_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)(**(long **)(txid_buf.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x38) +
                        (long)witness_stack * 0x10);
          in_stack_fffffffffffffa90 =
               *(uchar **)
                witness_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
          in_stack_fffffffffffffa98 =
               in_stack_fffffffffffffa90 +
               *(long *)((long)witness_buf.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage + 8);
          in_stack_fffffffffffffaa0 =
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_389;
          ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x435082);
          ::std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
                    (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
                     in_stack_fffffffffffffa88);
          ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x4350b1);
          ByteData::ByteData(&local_3c8,
                             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             (local_389 + 1));
          AbstractTxIn::AddScriptWitnessStack(&local_3b0,(AbstractTxIn *)local_328,&local_3c8);
          ScriptWitness::~ScriptWitness((ScriptWitness *)0x4350ee);
          ByteData::~ByteData((ByteData *)0x4350fa);
          ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffffa70);
        }
      }
      ::std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::push_back
                ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
                 &vout_work.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_328);
      TxIn::~TxIn((TxIn *)0x43523e);
      Script::~Script(in_stack_fffffffffffffa60);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffa70)
      ;
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffa70)
      ;
    }
    pcVar4 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_transaction.cpp"
                     ,0x2f);
    index_1 = (size_t)(pcVar4 + 1);
    local_3d8 = 0x1a7;
    local_3d0 = "SetFromHex";
    logger::info<unsigned_long&>
              ((CfdSourceLocation *)&index_1,"num_outputs={} ",&pwStack_60->num_outputs);
    if (!bVar1) {
      for (txout_item = (wally_tx_output *)0x0;
          txout_item < (wally_tx_output *)pwStack_60->num_outputs;
          txout_item = (wally_tx_output *)((long)&txout_item->satoshi + 1)) {
        script_buf_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)(pwStack_60->outputs + (long)txout_item);
        __a = (allocator_type *)
              ((long)&txout.super_AbstractTxOut.locking_script_.script_stack_.
                      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                      ._M_impl.super__Vector_impl_data + 0x17);
        ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x435384);
        ::std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
                  (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,__a
                  );
        ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x4353b3);
        AVar9 = Amount::CreateBySatoshiAmount
                          (*(int64_t *)
                            script_buf_1.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
        in_stack_fffffffffffffa70 = (string *)AVar9.amount_;
        local_478 = AVar9.ignore_check_;
        local_480 = in_stack_fffffffffffffa70;
        local_470.amount_ = (int64_t)in_stack_fffffffffffffa70;
        local_470.ignore_check_ = (bool)local_478;
        ByteData::ByteData((ByteData *)&exception,
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_408);
        Script::Script(&local_4b8,(ByteData *)&exception);
        TxOut::TxOut((TxOut *)local_460,&local_470,&local_4b8);
        Script::~Script(in_stack_fffffffffffffa60);
        ByteData::~ByteData((ByteData *)0x435463);
        ::std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::push_back
                  ((vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *)&tx_pointer,
                   (value_type *)local_460);
        TxOut::~TxOut((TxOut *)0x435481);
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffffa70);
      }
    }
    if (tx != (wally_tx *)0x0) {
      wally_tx_free(tx);
      ::std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::clear(&this->vin_);
      ::std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::clear(&this->vout_);
    }
    ::std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::operator=
              (&this->vin_,
               (vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
               &vout_work.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    ::std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::operator=
              (&this->vout_,
               (vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *)&tx_pointer);
    ::std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::~vector
              ((vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *)
               in_stack_fffffffffffffa70);
    ::std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::~vector
              ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
               in_stack_fffffffffffffa70);
    return;
  }
  local_1d0.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_transaction.cpp"
               ,0x2f);
  local_1d0.filename = local_1d0.filename + 1;
  local_1d0.line = 0x17f;
  local_1d0.funcname = "SetFromHex";
  logger::warn<int&>(&local_1d0,"wally_tx_from_hex NG[{}] ",&local_64);
  index._6_1_ = 1;
  uVar8 = __cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            (local_1f0,"transaction data invalid.",(allocator *)((long)&index + 7));
  CfdException::CfdException(in_stack_fffffffffffffa80,error_code,in_stack_fffffffffffffa70);
  index._6_1_ = 0;
  __cxa_throw(uVar8,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void Transaction::SetFromHex(const std::string &hex_string) {
  void *original_address = wally_tx_pointer_;
  bool append_txout = false;
  std::vector<TxIn> vin_work;
  std::vector<TxOut> vout_work;

  // It is assumed that tx information has been created.
  // (If it is not created, it will cause inconsistency)
  struct wally_tx *tx_pointer = NULL;
  int ret = wally_tx_from_hex(hex_string.c_str(), 0, &tx_pointer);
  if (ret == WALLY_OK) {
    if ((tx_pointer->num_inputs == 0) && (tx_pointer->num_outputs == 0) &&
        (hex_string.size() > kTransactionMinimumHexSize)) {
      // Judged as an invalid analysis condition when txin is 0 and txout is 1,
      // and enters the exception route
      // (libwally misidentifies as witness tx)
      wally_tx_free(tx_pointer);
      tx_pointer = NULL;
      ret = WALLY_EINVAL;
    }
  }

  if (ret == WALLY_EINVAL) {
    ByteData tx_byte = StringUtil::StringToByte(hex_string);
    const std::vector<uint8_t> &tx_buf = tx_byte.GetBytes();
    const uint8_t *address_pointer = tx_buf.data();

    // If the minimum size, perform analysis
    if (hex_string.size() >= kTransactionMinimumHexSize) {
      uint32_t version = 0;
      uint32_t lock_time = 0;
      memcpy(&version, address_pointer, sizeof(version));
      address_pointer += sizeof(version);
      if (*address_pointer != 0) {
        // marker is 1 or txin is greater than 1
        // Since type can be analyzed with libwally, treated as invalid data.
      } else {
        // txin is 0 or marker is 0
        ++address_pointer;
        if ((*address_pointer == 0) &&
            (hex_string.size() == kTransactionMinimumHexSize)) {
          // txout is 0
          ++address_pointer;
          memcpy(&lock_time, address_pointer, sizeof(lock_time));
          ret = wally_tx_init_alloc(version, lock_time, 0, 0, &tx_pointer);
          if (ret != WALLY_OK) {
            warn(CFD_LOG_SOURCE, "wally_tx_init_alloc NG[{}] ", ret);
            throw CfdException(
                kCfdIllegalArgumentError, "transaction data generate error.");
          }
          info(CFD_LOG_SOURCE, "call wally_tx_init_alloc");
        } else {
          // Check remaining size and check if txin is 0 and txout is 1 or more
          const uint8_t *start_address = tx_buf.data();
          size_t size = address_pointer - start_address;
          uint64_t txout_num = 0;
          size_t num_size = 0;
          // Subtract the size up to the txout area and the locktime
          // from the txbuf size.
          size_t buf_size = tx_buf.size() - size - sizeof(uint32_t);
          if (!GetVariableInt(
                  address_pointer, buf_size, &txout_num, &num_size)) {
            // Invalid
          } else if (!CheckTxOutBuffer(
                         address_pointer, buf_size, txout_num, num_size)) {
            // Invalid
          } else {
            // txout OK
            // locktime copy
            const uint8_t *work_address = address_pointer + buf_size;
            memcpy(&lock_time, work_address, sizeof(lock_time));
            ret = wally_tx_init_alloc(version, lock_time, 0, 0, &tx_pointer);
            if (ret != WALLY_OK) {
              warn(CFD_LOG_SOURCE, "wally_tx_init_alloc NG[{}] ", ret);
              throw CfdException(
                  kCfdIllegalArgumentError,
                  "transaction data generate error.");
            }
            info(CFD_LOG_SOURCE, "call wally_tx_init_alloc");
            append_txout = true;
            // Add data to TxOut again
            CheckTxOutBuffer(
                address_pointer, buf_size, txout_num, num_size, tx_pointer,
                &vout_work);
          }
        }
      }
    }
  }

  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_from_hex NG[{}] ", ret);
    throw CfdException(kCfdIllegalArgumentError, "transaction data invalid.");
  }
  wally_tx_pointer_ = tx_pointer;

  try {
    // create TxIn and TxOut
    for (size_t index = 0; index < tx_pointer->num_inputs; ++index) {
      struct wally_tx_input *txin_item = &tx_pointer->inputs[index];
      std::vector<uint8_t> txid_buf(
          txin_item->txhash, txin_item->txhash + sizeof(txin_item->txhash));
      std::vector<uint8_t> script_buf(
          txin_item->script, txin_item->script + txin_item->script_len);
      Script unlocking_script = Script(ByteData(script_buf));
      /* Temporarily comment out
      if (!unlocking_script.IsPushOnly()) {
        warn(CFD_LOG_SOURCE, "IsPushOnly() false.");
        throw CfdException(
            kCfdIllegalArgumentError,
            "unlocking script error. "
            "The script needs to be push operator only.");
      } */
      TxIn txin(
          Txid(ByteData256(txid_buf)), txin_item->index, txin_item->sequence,
          unlocking_script);
      if ((txin_item->witness != NULL) &&
          (txin_item->witness->num_items != 0)) {
        for (size_t w_index = 0; w_index < txin_item->witness->num_items;
             ++w_index) {
          struct wally_tx_witness_item *witness_stack;
          witness_stack = &txin_item->witness->items[w_index];
          const std::vector<uint8_t> witness_buf(
              witness_stack->witness,
              witness_stack->witness + witness_stack->witness_len);
          txin.AddScriptWitnessStack(ByteData(witness_buf));
        }
      }
      vin_work.push_back(txin);
    }

    info(CFD_LOG_SOURCE, "num_outputs={} ", tx_pointer->num_outputs);
    if (!append_txout) {
      for (size_t index = 0; index < tx_pointer->num_outputs; ++index) {
        struct wally_tx_output *txout_item = &tx_pointer->outputs[index];
        std::vector<uint8_t> script_buf(
            txout_item->script, txout_item->script + txout_item->script_len);
        TxOut txout(
            Amount::CreateBySatoshiAmount(txout_item->satoshi),
            Script(ByteData(script_buf)));
        vout_work.push_back(txout);
      }
    }
    // If the copy process is successful, free the old buffer
    if (original_address != NULL) {
      wally_tx_free(static_cast<struct wally_tx *>(original_address));
      vin_.clear();
      vout_.clear();
    }
    vin_ = vin_work;
    vout_ = vout_work;
  } catch (const CfdException &exception) {
    // free on error
    wally_tx_free(tx_pointer);
    wally_tx_pointer_ = original_address;
    throw exception;
  } catch (...) {
    // free on error
    wally_tx_free(tx_pointer);
    wally_tx_pointer_ = original_address;
    throw CfdException(kCfdUnknownError);
  }
}